

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

Location * __thiscall trieste::wf::Gen::location(Location *__return_storage_ptr__,Gen *this,Node *n)

{
  shared_ptr<trieste::NodeDef> local_30;
  Node *local_20;
  Node *n_local;
  Gen *this_local;
  
  local_20 = n;
  n_local = (Node *)this;
  this_local = (Gen *)__return_storage_ptr__;
  std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_30,n);
  CLI::std::
  function<trieste::Location_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&,_std::shared_ptr<trieste::NodeDef>)>
  ::operator()(__return_storage_ptr__,
               (function<trieste::Location_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&,_std::shared_ptr<trieste::NodeDef>)>
                *)&this->gloc,&this->rand,&local_30);
  std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Location location(Node n)
      {
        return gloc(rand, n);
      }